

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm.c
# Opt level: O3

void av1_round_shift_array_c(int32_t *arr,int size,int bit)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  
  if (bit != 0) {
    bVar1 = (byte)bit;
    if (bit < 1) {
      if (0 < size) {
        uVar2 = 0;
        do {
          lVar3 = (long)arr[uVar2] << (-bVar1 & 0x3f);
          if (0x7ffffffe < lVar3) {
            lVar3 = 0x7fffffff;
          }
          if (lVar3 < -0x7fffffff) {
            lVar3 = -0x80000000;
          }
          arr[uVar2] = (int32_t)lVar3;
          uVar2 = uVar2 + 1;
        } while ((uint)size != uVar2);
      }
    }
    else if (0 < size) {
      uVar2 = 0;
      do {
        arr[uVar2] = (int32_t)((long)arr[uVar2] + (1L << (bVar1 - 1 & 0x3f)) >> (bVar1 & 0x3f));
        uVar2 = uVar2 + 1;
      } while ((uint)size != uVar2);
    }
  }
  return;
}

Assistant:

void av1_round_shift_array_c(int32_t *arr, int size, int bit) {
  int i;
  if (bit == 0) {
    return;
  } else {
    if (bit > 0) {
      for (i = 0; i < size; i++) {
        arr[i] = round_shift(arr[i], bit);
      }
    } else {
      for (i = 0; i < size; i++) {
        arr[i] = (int32_t)clamp64(((int64_t)1 << (-bit)) * arr[i], INT32_MIN,
                                  INT32_MAX);
      }
    }
  }
}